

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

void __thiscall
ot::commissioner::coap::Coap::SendRequest(Coap *this,Request *aRequest,ResponseHandler *aHandler)

{
  char cVar1;
  ErrorCode EVar2;
  uint16_t uVar3;
  Error *pEVar4;
  char *from;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  shared_ptr<ot::commissioner::coap::Message> request;
  writer write;
  Error error;
  function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)> local_f8;
  string local_d8;
  undefined1 local_b8 [8];
  char *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  parse_func local_90 [1];
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  std::make_shared<ot::commissioner::coap::Message,ot::commissioner::coap::Message_const&>
            ((Message *)&request);
  if ((undefined1  [12])
      ((undefined1  [12])
       (request.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->mHeader & (undefined1  [12])0x8) == (undefined1  [12])0x0) {
    if (((request.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->mHeader).mMessageId != 0) {
      abort();
    }
    uVar3 = (short)*(undefined4 *)&this->mMessageId + 1;
    this->mMessageId = uVar3;
    ((request.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     )->mHeader).mMessageId = uVar3;
    Message::SetToken(request.
                      super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,'\b');
    Send((Error *)local_b8,this,
         request.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr);
    pEVar4 = Error::operator=(&error,(Error *)local_b8);
    EVar2 = pEVar4->mCode;
    std::__cxx11::string::~string((string *)&local_b0);
    if ((EVar2 == kNone) &&
       ((undefined1  [12])
        ((undefined1  [12])
         (request.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->mHeader & (undefined1  [12])0xc) == (undefined1  [12])0x0)) {
      std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
      function(&local_f8,aHandler);
      RequestsCache::Put(&this->mRequestsCache,&request,&local_f8);
      std::_Function_base::~_Function_base(&local_f8.super__Function_base);
    }
  }
  else {
    local_b8._0_4_ = none_type;
    local_b0 = "a CoAP request is neither Confirmable nor NON-Confirmable";
    local_a8 = 0x39;
    local_a0._M_allocated_capacity = 0;
    local_90[0] = (parse_func)0x0;
    from = "a CoAP request is neither Confirmable nor NON-Confirmable";
    write.handler_ = (format_string_checker<char> *)local_b8;
    local_a0._8_8_ = (format_string_checker<char> *)local_b8;
    while (from != "") {
      cVar1 = *from;
      to = from;
      while (cVar1 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,from,"");
          goto LAB_0019f57a;
        }
        cVar1 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                       (to,"",(format_string_checker<char> *)local_b8);
    }
LAB_0019f57a:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_b8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_d8,(v10 *)"a CoAP request is neither Confirmable nor NON-Confirmable",
               (string_view)ZEXT816(0x39),args);
    local_58._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_d8);
    Error::operator=(&error,(Error *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
    std::__cxx11::string::~string((string *)&local_d8);
  }
  if ((error.mCode != kNone) && ((aHandler->super__Function_base)._M_manager != (_Manager_type)0x0))
  {
    Error::Error((Error *)local_80,&error);
    std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
    operator()(aHandler,(Message *)0x0,(Error *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&request.
              super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&error.mMessage);
  return;
}

Assistant:

void Coap::SendRequest(const Request &aRequest, ResponseHandler aHandler)
{
    Error error;
    auto  request = std::make_shared<Request>(aRequest);

    VerifyOrExit(request->IsConfirmable() || request->IsNonConfirmable(),
                 error = ERROR_INVALID_ARGS("a CoAP request is neither Confirmable nor NON-Confirmable"));

    VerifyOrDie(request->GetMessageId() == 0);
    request->SetMessageId(AllocMessageId());
    request->SetToken(kDefaultTokenLength);

    SuccessOrExit(error = Send(*request));

    if (request->IsConfirmable())
    {
        mRequestsCache.Put(request, aHandler);
    }

exit:
    if (error != ErrorCode::kNone && aHandler != nullptr)
    {
        aHandler(nullptr, error);
    }
}